

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionInstance::ShaderTextureFunctionInstance
          (ShaderTextureFunctionInstance *this,Context *context,bool isVertexCase,
          ShaderEvaluator *evaluator,UniformSetup *uniformSetup,TextureLookupSpec *lookupSpec,
          TextureSpec *textureSpec,TexLookupParams *lookupParams,ImageBackingMode imageBackingMode)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  Function FVar1;
  TextureLookupSpec *pTVar2;
  undefined8 uVar3;
  TexLookupParams *pTVar4;
  PtrData<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> data;
  PtrData<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> data_00;
  PtrData<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> data_01;
  PtrData<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> data_02;
  PtrData<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> data_03;
  PtrData<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> data_04;
  PtrData<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> data_05;
  int iVar5;
  int iVar6;
  Texture1D *pTVar7;
  Texture1DArray *this_01;
  Texture3D *pTVar8;
  TextureCube *this_02;
  Texture2D *pTVar9;
  Texture2DArray *this_03;
  TextureCubeArray *this_04;
  TextureBinding *pTVar10;
  TextureSpec *pTVar11;
  ulong uVar12;
  int level;
  int iVar13;
  long lVar14;
  PixelBufferAccess *access;
  ConstPixelBufferAccess *this_05;
  long lVar15;
  int face_1;
  long lVar16;
  int layer;
  int iVar17;
  Vector<int,_4> *pVVar18;
  int face;
  int iVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  CubeFaceFloatCoords CVar26;
  CubeFaceFloatCoords CVar27;
  CubeFaceFloatCoords CVar28;
  Vec3 sy;
  Vec4 colorA;
  Vec4 colorB_1;
  Vec4 colorA_1;
  Vec4 colorB;
  float local_1d4;
  UVec2 viewportSize;
  long local_1c8;
  Vec2 f_1;
  Vec4 colorB_3;
  Vec4 s;
  float local_178;
  TextureFormat texFmt;
  Vec2 f;
  TexLookupParams lookupParams_1;
  Vec4 b;
  float lodCoordTrans [16];
  Vec4 colorB_6;
  Vector<float,_4> local_40;
  
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (&this->super_ShaderRenderCaseInstance,context,isVertexCase,evaluator,uniformSetup,
             (AttributeSetupFunc)0x0,imageBackingMode,0);
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bd2d88;
  this->m_lookupSpec = lookupSpec;
  this->m_textureSpec = textureSpec;
  this->m_lookupParams = lookupParams;
  checkDeviceFeatures((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context,
                      textureSpec->type);
  tcu::operator-((tcu *)&s,&this->m_lookupSpec->maxCoord,&this->m_lookupSpec->minCoord);
  tcu::Vector<float,_4>::Vector(&b,&this->m_lookupSpec->minCoord);
  lodCoordTrans[1] = 0.0;
  lodCoordTrans[2] = 0.0;
  lodCoordTrans[0] = s.m_data[0];
  lodCoordTrans[3] = b.m_data[0];
  lodCoordTrans._16_8_ = s.m_data._0_8_ & 0xffffffff00000000;
  lodCoordTrans[6] = 0.0;
  lodCoordTrans[7] = b.m_data[1];
  lodCoordTrans[9] = s.m_data[2] * -0.5;
  lodCoordTrans[8] = s.m_data[2] * 0.5;
  lodCoordTrans[10] = 0.0;
  lodCoordTrans[0xb] = s.m_data[2] * 0.5 + b.m_data[2];
  lodCoordTrans[0xd] = s.m_data[3] * 0.5;
  lodCoordTrans[0xc] = s.m_data[3] * -0.5;
  lodCoordTrans[0xe] = 0.0;
  lodCoordTrans[0xf] = s.m_data[3] * 0.5 + b.m_data[3];
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&lookupParams_1,lodCoordTrans);
  this_00 = &(this->super_ShaderRenderCaseInstance).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)&lookupParams_1);
  ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,4,A_IN0);
  pTVar2 = this->m_lookupSpec;
  FVar1 = pTVar2->function;
  if (((FVar1 < FUNCTION_LAST) && ((0x10f0U >> (FVar1 & 0x1f) & 1) != 0)) ||
     (pTVar2->useBias == true)) {
    lodCoordTrans._16_16_ = ZEXT816(0);
    lodCoordTrans[1] = (pTVar2->maxLodBias - pTVar2->minLodBias) * 0.5;
    lodCoordTrans[0] = lodCoordTrans[1];
    lodCoordTrans[2] = 0.0;
    lodCoordTrans[3] = pTVar2->minLodBias;
    lodCoordTrans._32_16_ = lodCoordTrans._16_16_;
    lodCoordTrans._48_16_ = lodCoordTrans._16_16_;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&lookupParams_1,lodCoordTrans);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)&lookupParams_1);
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,5,A_IN1);
  }
  else if ((FVar1 & ~FUNCTION_TEXTUREPROJ3) == FUNCTION_TEXTUREGRAD) {
    tcu::operator-((tcu *)&b,&pTVar2->maxDX,&pTVar2->minDX);
    tcu::operator-((tcu *)&sy,&this->m_lookupSpec->maxDY,&this->m_lookupSpec->minDY);
    lodCoordTrans[1] = b.m_data[0] * 0.5;
    lodCoordTrans[0] = b.m_data[0] * 0.5;
    lodCoordTrans[2] = 0.0;
    pTVar2 = this->m_lookupSpec;
    lodCoordTrans[3] = (pTVar2->minDX).m_data[0];
    lodCoordTrans[5] = b.m_data[1] * 0.5;
    lodCoordTrans[4] = b.m_data[1] * 0.5;
    lodCoordTrans[6] = 0.0;
    lodCoordTrans[7] = (pTVar2->minDX).m_data[1];
    lodCoordTrans[9] = b.m_data[2] * 0.5;
    lodCoordTrans[8] = b.m_data[2] * 0.5;
    lodCoordTrans[10] = 0.0;
    lodCoordTrans[0xb] = (pTVar2->minDX).m_data[2];
    lookupParams_1.lod = sy.m_data[0] * -0.5;
    lookupParams_1.offset.m_data[1] = 0;
    lodCoordTrans._48_16_ = ZEXT816(0);
    lookupParams_1.offset.m_data[2] = (int)(pTVar2->maxDY).m_data[0];
    lookupParams_1.scale.m_data[1] = sy.m_data[1] * -0.5;
    lookupParams_1.scale.m_data[0] = sy.m_data[1] * -0.5;
    lookupParams_1.scale.m_data._8_8_ = (ulong)(uint)(pTVar2->maxDY).m_data[1] << 0x20;
    lookupParams_1.bias.m_data[1] = sy.m_data[2] * -0.5;
    lookupParams_1.bias.m_data[0] = sy.m_data[2] * -0.5;
    lookupParams_1.bias.m_data._8_8_ = (ulong)(uint)(pTVar2->maxDY).m_data[2] << 0x20;
    lookupParams_1.offset.m_data[0] = (int)lookupParams_1.lod;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&s,lodCoordTrans);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)&s);
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&s,&lookupParams_1.lod);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)&s);
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,5,A_IN1);
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,6,A_IN2);
  }
  if ((sr::(anonymous_namespace)::ShaderTextureFunctionInstance::initTexture()::texCubeSwz == '\0')
     && (iVar6 = __cxa_guard_acquire(&sr::(anonymous_namespace)::ShaderTextureFunctionInstance::
                                      initTexture()::texCubeSwz), iVar6 != 0)) {
    _texCubeSwz = 0;
    _DAT_00c1b668 = 0x100000001;
    _DAT_00c1b670 = 0x100000001;
    uRam0000000000c1b678 = 0;
    _DAT_00c1b680 = 0x100000000;
    uRam0000000000c1b688 = 0x100000000;
    _DAT_00c1b690 = 1;
    uRam0000000000c1b698 = 1;
    _DAT_00c1b6a0 = 0x100000000;
    uRam0000000000c1b6a8 = 1;
    _DAT_00c1b6b0 = 1;
    uRam0000000000c1b6b4 = 0;
    uRam0000000000c1b6b8 = 0;
    uRam0000000000c1b6bc = 1;
    __cxa_guard_release(&sr::(anonymous_namespace)::ShaderTextureFunctionInstance::initTexture()::
                         texCubeSwz);
  }
  texFmt = glu::mapGLInternalFormat(this->m_textureSpec->format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)lodCoordTrans,&texFmt);
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  FVar1 = this->m_lookupSpec->function;
  bVar21 = (this->super_ShaderRenderCaseInstance).m_isVertexCase != false;
  bVar20 = FUNCTION_TEXTUREPROJ3 < FVar1;
  if ((FVar1 - FUNCTION_TEXTUREPROJGRAD < 3) ||
     ((FVar1 & ~FUNCTION_TEXTURELOD) - FUNCTION_TEXTUREPROJ < 3)) {
    uVar12 = (ulong)(FVar1 == FUNCTION_TEXTUREPROJ3 ^ 3);
    if (FVar1 == FUNCTION_TEXTUREPROJ2) {
      uVar12 = 1;
    }
    fVar22 = 1.0 / (this->m_lookupSpec->minCoord).m_data[uVar12];
  }
  else {
    fVar22 = 1.0;
  }
  TexLookupParams::TexLookupParams(&lookupParams_1);
  pTVar11 = this->m_textureSpec;
  switch(pTVar11->type) {
  case TEXTURETYPE_1D:
    fVar25 = 0.0;
    if (bVar20 || bVar21) {
      iVar6 = pTVar11->numLevels + -1;
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      fVar25 = 1.0 / (float)iVar6;
    }
    tcu::operator-((tcu *)&s,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector(&b,(Vector<float,_4> *)lodCoordTrans);
    iVar6 = this->m_textureSpec->width;
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    pTVar7 = (Texture1D *)operator_new(0x50);
    tcu::Texture1D::Texture1D(pTVar7,&texFmt,iVar6);
    colorA.m_data[0] = 0.0;
    colorA.m_data[1] = 0.0;
    data._8_4_ = sy.m_data[0];
    data.ptr = (Texture1D *)this;
    data._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::assignData
              ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&sy,data);
    access = (PixelBufferAccess *)&colorA;
    de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)access);
    lVar15 = 0;
    for (lVar14 = 0; lVar14 < this->m_textureSpec->numLevels; lVar14 = lVar14 + 1) {
      fVar24 = (float)(int)lVar14 * fVar25;
      fVar23 = 1.0 - fVar24;
      colorA_1.m_data[1] = fVar23;
      colorA_1.m_data[0] = fVar24;
      colorA_1.m_data[2] = fVar24;
      colorA_1.m_data[3] = fVar23;
      tcu::operator*((tcu *)&colorB,&s,(Vector<float,_4> *)&colorA_1);
      tcu::operator+((tcu *)&colorA,&b,(Vector<float,_4> *)&colorB);
      colorB_1.m_data[0] = fVar23;
      colorB_1.m_data[1] = fVar24;
      colorB_1.m_data[2] = fVar23;
      colorB_1.m_data[3] = fVar24;
      tcu::operator*((tcu *)&colorA_1,&s,&colorB_1);
      tcu::operator+((tcu *)&colorB,&b,(Vector<float,_4> *)&colorA_1);
      tcu::Texture1D::allocLevel((Texture1D *)CONCAT44(sy.m_data[1],sy.m_data[0]),(int)lVar14);
      iVar5 = iVar6 / 4 >> ((byte)lVar14 & 0x1f);
      access = (PixelBufferAccess *)(*(long *)(CONCAT44(sy.m_data[1],sy.m_data[0]) + 0x20) + lVar15)
      ;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      tcu::fillWithGrid(access,iVar5,&colorA,&colorB);
      lVar15 = lVar15 + 0x28;
    }
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   ((LodMode)access,
                    ((float)this->m_textureSpec->width *
                    fVar22 * ((this->m_lookupSpec->maxCoord).m_data[0] -
                             (this->m_lookupSpec->minCoord).m_data[0])) /
                    (float)viewportSize.m_data[0],0.0);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    pTVar7 = (Texture1D *)CONCAT44(sy.m_data[1],sy.m_data[0]);
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,pTVar7,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&colorA,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&colorA);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&colorA);
    de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&sy);
    break;
  case TEXTURETYPE_2D:
    fVar25 = 0.0;
    if (bVar20 || bVar21) {
      iVar6 = pTVar11->numLevels + -1;
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      fVar25 = 1.0 / (float)iVar6;
    }
    tcu::operator-((tcu *)&s,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector(&b,(Vector<float,_4> *)lodCoordTrans);
    iVar6 = this->m_textureSpec->width;
    iVar5 = this->m_textureSpec->height;
    iVar17 = iVar6 / 4;
    iVar13 = iVar5 / 4;
    if (iVar17 < iVar13) {
      iVar13 = iVar17;
    }
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    pTVar9 = (Texture2D *)operator_new(0x50);
    tcu::Texture2D::Texture2D(pTVar9,&texFmt,iVar6,iVar5);
    colorA.m_data[0] = 0.0;
    colorA.m_data[1] = 0.0;
    data_03._8_4_ = sy.m_data[0];
    data_03.ptr = (Texture2D *)this;
    data_03._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::assignData
              ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&sy,data_03);
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&colorA);
    lVar15 = 0;
    for (lVar14 = 0; pTVar11 = this->m_textureSpec, lVar14 < pTVar11->numLevels; lVar14 = lVar14 + 1
        ) {
      fVar24 = (float)(int)lVar14 * fVar25;
      fVar23 = 1.0 - fVar24;
      colorA_1.m_data[1] = fVar23;
      colorA_1.m_data[0] = fVar24;
      colorA_1.m_data[2] = fVar24;
      colorA_1.m_data[3] = fVar23;
      tcu::operator*((tcu *)&colorB,&s,(Vector<float,_4> *)&colorA_1);
      tcu::operator+((tcu *)&colorA,&b,(Vector<float,_4> *)&colorB);
      colorB_1.m_data[0] = fVar23;
      colorB_1.m_data[1] = fVar24;
      colorB_1.m_data[2] = fVar23;
      colorB_1.m_data[3] = fVar24;
      tcu::operator*((tcu *)&colorA_1,&s,&colorB_1);
      tcu::operator+((tcu *)&colorB,&b,(Vector<float,_4> *)&colorA_1);
      tcu::Texture2D::allocLevel((Texture2D *)CONCAT44(sy.m_data[1],sy.m_data[0]),(int)lVar14);
      iVar6 = iVar13 >> ((byte)lVar14 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      tcu::fillWithGrid((PixelBufferAccess *)
                        (*(long *)(CONCAT44(sy.m_data[1],sy.m_data[0]) + 0x20) + lVar15),iVar6,
                        &colorA,&colorB);
      lVar15 = lVar15 + 0x28;
    }
    pTVar2 = this->m_lookupSpec;
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   (LODMODE_EXACT,
                    ((float)pTVar11->width *
                    ((pTVar2->maxCoord).m_data[0] - (pTVar2->minCoord).m_data[0]) * fVar22) /
                    (float)viewportSize.m_data[0],0.0,0.0,
                    ((float)pTVar11->height *
                    ((pTVar2->maxCoord).m_data[1] - (pTVar2->minCoord).m_data[1]) * fVar22) /
                    (float)viewportSize.m_data[1]);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    pTVar9 = (Texture2D *)CONCAT44(sy.m_data[1],sy.m_data[0]);
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,pTVar9,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&colorA,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&colorA);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&colorA);
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&sy);
    break;
  case TEXTURETYPE_3D:
    fVar25 = 0.0;
    if (bVar20 || bVar21) {
      iVar6 = pTVar11->numLevels + -1;
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      fVar25 = 1.0 / (float)iVar6;
    }
    tcu::operator-((tcu *)&s,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector(&b,(Vector<float,_4> *)lodCoordTrans);
    pTVar11 = this->m_textureSpec;
    iVar6 = pTVar11->width;
    iVar5 = pTVar11->height;
    iVar17 = iVar6 / 2;
    iVar13 = iVar5 / 2;
    if (iVar17 < iVar13) {
      iVar13 = iVar17;
    }
    iVar17 = pTVar11->depth;
    iVar19 = iVar17 / 2;
    if (iVar19 <= iVar13) {
      iVar13 = iVar19;
    }
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    pTVar8 = (Texture3D *)operator_new(0x58);
    tcu::Texture3D::Texture3D(pTVar8,&texFmt,iVar6,iVar5,iVar17);
    colorA.m_data[0] = 0.0;
    colorA.m_data[1] = 0.0;
    data_01._8_4_ = sy.m_data[0];
    data_01.ptr = (Texture3D *)this;
    data_01._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::assignData
              ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&sy,data_01);
    de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&colorA);
    lVar15 = 0;
    for (lVar14 = 0; pTVar11 = this->m_textureSpec, lVar14 < pTVar11->numLevels; lVar14 = lVar14 + 1
        ) {
      fVar24 = (float)(int)lVar14 * fVar25;
      fVar23 = 1.0 - fVar24;
      colorA_1.m_data[1] = fVar23;
      colorA_1.m_data[0] = fVar24;
      colorA_1.m_data[2] = fVar24;
      colorA_1.m_data[3] = fVar23;
      tcu::operator*((tcu *)&colorB,&s,(Vector<float,_4> *)&colorA_1);
      tcu::operator+((tcu *)&colorA,&b,(Vector<float,_4> *)&colorB);
      colorB_1.m_data[0] = fVar23;
      colorB_1.m_data[1] = fVar24;
      colorB_1.m_data[2] = fVar23;
      colorB_1.m_data[3] = fVar24;
      tcu::operator*((tcu *)&colorA_1,&s,&colorB_1);
      tcu::operator+((tcu *)&colorB,&b,(Vector<float,_4> *)&colorA_1);
      tcu::Texture3D::allocLevel((Texture3D *)CONCAT44(sy.m_data[1],sy.m_data[0]),(int)lVar14);
      iVar6 = iVar13 >> ((byte)lVar14 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      tcu::fillWithGrid((PixelBufferAccess *)
                        (*(long *)(CONCAT44(sy.m_data[1],sy.m_data[0]) + 0x20) + lVar15),iVar6,
                        &colorA,&colorB);
      lVar15 = lVar15 + 0x28;
    }
    pTVar2 = this->m_lookupSpec;
    fVar25 = (float)pTVar11->depth *
             ((pTVar2->maxCoord).m_data[2] - (pTVar2->minCoord).m_data[2]) * 0.5 * fVar22;
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   (LODMODE_EXACT,
                    ((float)pTVar11->width *
                    ((pTVar2->maxCoord).m_data[0] - (pTVar2->minCoord).m_data[0]) * fVar22) /
                    (float)viewportSize.m_data[0],0.0,fVar25 / (float)viewportSize.m_data[0],0.0,
                    ((float)pTVar11->height *
                    ((pTVar2->maxCoord).m_data[1] - (pTVar2->minCoord).m_data[1]) * fVar22) /
                    (float)viewportSize.m_data[1],fVar25 / (float)viewportSize.m_data[1]);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    pTVar8 = (Texture3D *)CONCAT44(sy.m_data[1],sy.m_data[0]);
    sy.m_data[0] = 0.0;
    sy.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,pTVar8,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&colorA,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&colorA);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&colorA);
    de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::~UniqueBase
              ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&sy);
    break;
  case TEXTURETYPE_CUBE_MAP:
    fVar25 = 0.0;
    if (bVar20 || bVar21) {
      iVar6 = pTVar11->numLevels + -1;
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      fVar25 = 1.0 / (float)iVar6;
    }
    tcu::operator-((tcu *)&b,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&sy,(Vector<float,_4> *)lodCoordTrans);
    tcu::operator*((tcu *)&s,0.5,&b);
    tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)&sy,&s);
    pTVar11 = this->m_textureSpec;
    iVar5 = pTVar11->width / 4;
    iVar6 = pTVar11->height / 4;
    if (iVar5 < iVar6) {
      iVar6 = iVar5;
    }
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    this_02 = (TextureCube *)operator_new(0x168);
    tcu::TextureCube::TextureCube(this_02,&texFmt,pTVar11->width);
    s.m_data[0] = 0.0;
    s.m_data[1] = 0.0;
    data_02._8_4_ = sy.m_data[0];
    data_02.ptr = (TextureCube *)this;
    data_02._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::assignData
              ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&colorB,
               data_02);
    de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~UniqueBase
              ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&s);
    for (lVar14 = 0; lVar14 < this->m_textureSpec->numLevels; lVar14 = lVar14 + 1) {
      f.m_data[0] = (float)(int)lVar14 * fVar25;
      f.m_data[1] = 1.0 - f.m_data[0];
      iVar5 = iVar6 >> ((byte)lVar14 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      local_1c8 = 0xa0;
      pVVar18 = (Vector<int,_4> *)
                &sr::(anonymous_namespace)::ShaderTextureFunctionInstance::initTexture()::texCubeSwz
      ;
      for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
        tcu::operator-((tcu *)&colorA_1,1,pVVar18);
        colorB_3.m_data[0] = f.m_data[pVVar18->m_data[0]];
        colorB_3.m_data[1] = f.m_data[pVVar18->m_data[1]];
        colorB_3.m_data[2] = f.m_data[pVVar18->m_data[2]];
        colorB_3.m_data[3] = f.m_data[pVVar18->m_data[3]];
        tcu::operator*((tcu *)&s,&b,&colorB_3);
        tcu::operator+((tcu *)&colorB_1,(Vector<float,_4> *)&sy,(Vector<float,_4> *)&s);
        colorB_6.m_data[0] = f.m_data[(int)colorA_1.m_data[0]];
        colorB_6.m_data[1] = f.m_data[(int)colorA_1.m_data[1]];
        colorB_6.m_data[2] = f.m_data[(int)colorA_1.m_data[2]];
        colorB_6.m_data[3] = f.m_data[(int)colorA_1.m_data[3]];
        tcu::operator*((tcu *)&s,&b,&colorB_6);
        tcu::operator+((tcu *)&colorB_3,(Vector<float,_4> *)&sy,(Vector<float,_4> *)&s);
        tcu::TextureCube::allocLevel
                  ((TextureCube *)colorB.m_data._0_8_,(CubeFace)lVar15,(int)lVar14);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&s,
                   (ConstPixelBufferAccess *)
                   (*(long *)(colorB.m_data._0_8_ + local_1c8) + lVar14 * 0x28));
        fVar23 = s.m_data[2];
        tcu::fillWithGrid((PixelBufferAccess *)&s,iVar5,&colorB_1,&colorB_3);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&s,&colorA,0,0,0);
        iVar13 = (int)fVar23 + -1;
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&s,&colorA,0,iVar13,0);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&s,&colorA,iVar13,0,0);
        tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&s,&colorA,iVar13,iVar13,0);
        local_1c8 = local_1c8 + 0x18;
        pVVar18 = pVVar18 + 1;
      }
    }
    s.m_data[2] = (this->m_lookupSpec->minCoord).m_data[2] * fVar22;
    uVar3 = *(undefined8 *)(this->m_lookupSpec->minCoord).m_data;
    s.m_data[0] = (float)uVar3 * fVar22;
    s.m_data[1] = (float)((ulong)uVar3 >> 0x20) * fVar22;
    CVar26 = tcu::getCubeFaceCoords((Vec3 *)&s);
    pTVar2 = this->m_lookupSpec;
    s.m_data[2] = (pTVar2->minCoord).m_data[2] * fVar22;
    s.m_data[0] = (pTVar2->maxCoord).m_data[0] * fVar22;
    s.m_data[1] = (pTVar2->minCoord).m_data[1] * fVar22;
    CVar27 = tcu::getCubeFaceCoords((Vec3 *)&s);
    pTVar2 = this->m_lookupSpec;
    s.m_data[2] = fVar22 * (pTVar2->minCoord).m_data[2];
    s.m_data[0] = fVar22 * (pTVar2->minCoord).m_data[0];
    s.m_data[1] = fVar22 * (pTVar2->maxCoord).m_data[1];
    CVar28 = tcu::getCubeFaceCoords((Vec3 *)&s);
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   (LODMODE_EXACT,
                    ((float)this->m_textureSpec->width * (CVar27.s - CVar26.s)) /
                    (float)viewportSize.m_data[0],0.0,0.0,
                    ((float)this->m_textureSpec->height * (CVar28.t - CVar26.t)) /
                    (float)viewportSize.m_data[1]);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    uVar3 = colorB.m_data._0_8_;
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,(TextureCube *)uVar3,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&s,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~UniqueBase
              ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&colorB);
    break;
  case TEXTURETYPE_1D_ARRAY:
    iVar6 = pTVar11->depth;
    fVar25 = 0.0;
    if (bVar20 || bVar21) {
      iVar5 = pTVar11->numLevels + -1;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      fVar25 = 1.0 / (float)(iVar5 * iVar6);
    }
    tcu::operator-((tcu *)&sy,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector(&colorA,(Vector<float,_4> *)lodCoordTrans);
    pTVar11 = this->m_textureSpec;
    iVar5 = pTVar11->width;
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    this_01 = (Texture1DArray *)operator_new(0x50);
    tcu::Texture1DArray::Texture1DArray(this_01,&texFmt,pTVar11->width,pTVar11->depth);
    s.m_data[0] = 0.0;
    s.m_data[1] = 0.0;
    data_00._8_4_ = sy.m_data[0];
    data_00.ptr = (Texture1DArray *)this;
    data_00._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
    assignData((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)&colorB,
               data_00);
    this_05 = (ConstPixelBufferAccess *)&s;
    de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
    ~UniqueBase((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)this_05
               );
    for (lVar14 = 0; lVar14 < this->m_textureSpec->numLevels; lVar14 = lVar14 + 1) {
      tcu::Texture1DArray::allocLevel((Texture1DArray *)colorB.m_data._0_8_,(int)lVar14);
      this_05 = (ConstPixelBufferAccess *)&s;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (this_05,(ConstPixelBufferAccess *)
                         (lVar14 * 0x28 + *(long *)(colorB.m_data._0_8_ + 0x20)));
      iVar13 = iVar5 / 4 >> ((byte)lVar14 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      for (iVar17 = 0; iVar17 < (int)s.m_data[3]; iVar17 = iVar17 + 1) {
        fVar24 = (float)iVar17 * (1.0 / (float)iVar6) + (float)(int)lVar14 * fVar25;
        fVar23 = 1.0 - fVar24;
        colorB_1.m_data[0] = fVar24;
        colorB_1.m_data[1] = fVar23;
        colorB_1.m_data[2] = fVar24;
        colorB_1.m_data[3] = fVar23;
        tcu::operator*((tcu *)&b,(Vector<float,_4> *)&sy,(Vector<float,_4> *)&colorB_1);
        tcu::operator+((tcu *)&colorA_1,&colorA,(Vector<float,_4> *)&b);
        colorB_3.m_data[0] = fVar23;
        colorB_3.m_data[1] = fVar24;
        colorB_3.m_data[2] = fVar23;
        colorB_3.m_data[3] = fVar24;
        tcu::operator*((tcu *)&b,(Vector<float,_4> *)&sy,&colorB_3);
        tcu::operator+((tcu *)&colorB_1,&colorA,(Vector<float,_4> *)&b);
        tcu::getSubregion((PixelBufferAccess *)&b,(PixelBufferAccess *)&s,0,iVar17,0,
                          (int)s.m_data[2],1,1);
        this_05 = (ConstPixelBufferAccess *)&b;
        tcu::fillWithGrid((PixelBufferAccess *)&b,iVar13,&colorA_1,&colorB_1);
      }
    }
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   ((LodMode)this_05,
                    ((float)this->m_textureSpec->width *
                    fVar22 * ((this->m_lookupSpec->maxCoord).m_data[0] -
                             (this->m_lookupSpec->minCoord).m_data[0])) /
                    (float)viewportSize.m_data[0],0.0);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    uVar3 = colorB.m_data._0_8_;
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,(Texture1DArray *)uVar3,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&s,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::
    ~UniqueBase((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)&colorB
               );
    break;
  case TEXTURETYPE_2D_ARRAY:
    iVar6 = pTVar11->depth;
    fVar25 = 0.0;
    if (bVar20 || bVar21) {
      iVar5 = pTVar11->numLevels + -1;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      fVar25 = 1.0 / (float)(iVar5 * iVar6);
    }
    tcu::operator-((tcu *)&sy,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector(&colorA,(Vector<float,_4> *)lodCoordTrans);
    pTVar11 = this->m_textureSpec;
    iVar13 = pTVar11->width / 4;
    iVar5 = pTVar11->height / 4;
    if (iVar13 < iVar5) {
      iVar5 = iVar13;
    }
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    this_03 = (Texture2DArray *)operator_new(0x58);
    tcu::Texture2DArray::Texture2DArray
              (this_03,&texFmt,pTVar11->width,pTVar11->height,pTVar11->depth);
    s.m_data[0] = 0.0;
    s.m_data[1] = 0.0;
    data_04._8_4_ = sy.m_data[0];
    data_04.ptr = (Texture2DArray *)this;
    data_04._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
    assignData((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)&colorB,
               data_04);
    de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)&s);
    for (lVar14 = 0; pTVar11 = this->m_textureSpec, lVar14 < pTVar11->numLevels; lVar14 = lVar14 + 1
        ) {
      tcu::Texture2DArray::allocLevel((Texture2DArray *)colorB.m_data._0_8_,(int)lVar14);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&s,
                 (ConstPixelBufferAccess *)(lVar14 * 0x28 + *(long *)(colorB.m_data._0_8_ + 0x20)));
      iVar13 = iVar5 >> ((byte)lVar14 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      for (iVar17 = 0; iVar17 < (int)local_178; iVar17 = iVar17 + 1) {
        fVar24 = (float)iVar17 * (1.0 / (float)iVar6) + (float)(int)lVar14 * fVar25;
        fVar23 = 1.0 - fVar24;
        colorB_1.m_data[0] = fVar24;
        colorB_1.m_data[1] = fVar23;
        colorB_1.m_data[2] = fVar24;
        colorB_1.m_data[3] = fVar23;
        tcu::operator*((tcu *)&b,(Vector<float,_4> *)&sy,(Vector<float,_4> *)&colorB_1);
        tcu::operator+((tcu *)&colorA_1,&colorA,(Vector<float,_4> *)&b);
        colorB_3.m_data[0] = fVar23;
        colorB_3.m_data[1] = fVar24;
        colorB_3.m_data[2] = fVar23;
        colorB_3.m_data[3] = fVar24;
        tcu::operator*((tcu *)&b,(Vector<float,_4> *)&sy,&colorB_3);
        tcu::operator+((tcu *)&colorB_1,&colorA,(Vector<float,_4> *)&b);
        tcu::getSubregion((PixelBufferAccess *)&b,(PixelBufferAccess *)&s,0,0,iVar17,
                          (int)s.m_data[2],(int)s.m_data[3],1);
        tcu::fillWithGrid((PixelBufferAccess *)&b,iVar13,&colorA_1,&colorB_1);
      }
    }
    pTVar2 = this->m_lookupSpec;
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   (LODMODE_EXACT,
                    ((float)pTVar11->width *
                    ((pTVar2->maxCoord).m_data[0] - (pTVar2->minCoord).m_data[0]) * fVar22) /
                    (float)viewportSize.m_data[0],0.0,0.0,
                    ((float)pTVar11->height *
                    ((pTVar2->maxCoord).m_data[1] - (pTVar2->minCoord).m_data[1]) * fVar22) /
                    (float)viewportSize.m_data[1]);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    uVar3 = colorB.m_data._0_8_;
    colorB.m_data[0] = 0.0;
    colorB.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,(Texture2DArray *)uVar3,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&s,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::
    ~UniqueBase((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)&colorB
               );
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    iVar6 = pTVar11->depth / 6;
    local_1d4 = 0.0;
    if (bVar20 || bVar21) {
      iVar5 = pTVar11->numLevels + -1;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      local_1d4 = 1.0 / (float)(iVar5 * iVar6);
    }
    tcu::operator-((tcu *)&sy,(Vector<float,_4> *)(lodCoordTrans + 4),
                   (Vector<float,_4> *)lodCoordTrans);
    tcu::Vector<float,_4>::Vector(&colorA,(Vector<float,_4> *)lodCoordTrans);
    tcu::operator*((tcu *)&s,0.5,(Vector<float,_4> *)&sy);
    tcu::operator+((tcu *)&colorB,&colorA,&s);
    pTVar11 = this->m_textureSpec;
    iVar13 = pTVar11->width / 4;
    iVar5 = pTVar11->height / 4;
    if (iVar13 < iVar5) {
      iVar5 = iVar13;
    }
    colorA_1.m_data[0] = 0.0;
    colorA_1.m_data[1] = 0.0;
    this_04 = (TextureCubeArray *)operator_new(0x50);
    tcu::TextureCubeArray::TextureCubeArray(this_04,&texFmt,pTVar11->width,pTVar11->depth);
    s.m_data[0] = 0.0;
    s.m_data[1] = 0.0;
    data_05._8_4_ = sy.m_data[0];
    data_05.ptr = (TextureCubeArray *)this;
    data_05._12_4_ = sy.m_data[1];
    de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    assignData((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
               &colorA_1,data_05);
    de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)&s)
    ;
    pTVar11 = this->m_textureSpec;
    for (lVar14 = 0; lVar14 < pTVar11->numLevels; lVar14 = lVar14 + 1) {
      f_1.m_data[0] = (float)(int)lVar14 * local_1d4;
      f_1.m_data[1] = 1.0 - f_1.m_data[0];
      tcu::TextureCubeArray::allocLevel((TextureCubeArray *)colorA_1.m_data._0_8_,(int)lVar14);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&s,
                 (ConstPixelBufferAccess *)(lVar14 * 0x28 + *(long *)(colorA_1.m_data._0_8_ + 0x20))
                );
      iVar13 = iVar5 >> ((byte)lVar14 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      iVar17 = 0;
      for (lVar15 = 0; pTVar11 = this->m_textureSpec, lVar15 < pTVar11->depth / 6;
          lVar15 = lVar15 + 1) {
        fVar25 = 1.0 - (float)(int)lVar15 * (1.0 / (float)iVar6);
        pVVar18 = (Vector<int,_4> *)
                  &sr::(anonymous_namespace)::ShaderTextureFunctionInstance::initTexture()::
                   texCubeSwz;
        for (lVar16 = 0; lVar16 != 6; lVar16 = lVar16 + 1) {
          tcu::operator-((tcu *)&colorB_1,1,pVVar18);
          f.m_data[0] = f_1.m_data[pVVar18->m_data[0]];
          f.m_data[1] = f_1.m_data[pVVar18->m_data[1]];
          tcu::operator*((tcu *)&colorB_6,(Vector<float,_4> *)&sy,(Vector<float,_4> *)&f);
          tcu::operator*((tcu *)&b,fVar25,(Vector<float,_4> *)&colorB_6);
          tcu::operator+((tcu *)&colorB_3,&colorA,(Vector<float,_4> *)&b);
          local_40.m_data[0] = f_1.m_data[(int)colorB_1.m_data[0]];
          local_40.m_data[1] = f_1.m_data[(int)colorB_1.m_data[1]];
          local_40.m_data[2] = f_1.m_data[(int)colorB_1.m_data[2]];
          local_40.m_data[3] = f_1.m_data[(int)colorB_1.m_data[3]];
          tcu::operator*((tcu *)&f,(Vector<float,_4> *)&sy,&local_40);
          tcu::operator*((tcu *)&b,fVar25,(Vector<float,_4> *)&f);
          tcu::operator+((tcu *)&colorB_6,&colorA,(Vector<float,_4> *)&b);
          tcu::getSubregion((PixelBufferAccess *)&b,(PixelBufferAccess *)&s,0,0,iVar17 + (int)lVar16
                            ,(int)s.m_data[2],(int)s.m_data[3],1);
          fVar23 = b.m_data[2];
          tcu::fillWithGrid((PixelBufferAccess *)&b,iVar13,&colorB_3,&colorB_6);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&b,&colorB,0,0,0);
          iVar19 = (int)fVar23 + -1;
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&b,&colorB,0,iVar19,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&b,&colorB,iVar19,0,0);
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&b,&colorB,iVar19,iVar19,0);
          pVVar18 = pVVar18 + 1;
        }
        iVar17 = iVar17 + 6;
      }
    }
    s.m_data[2] = (this->m_lookupSpec->minCoord).m_data[2] * fVar22;
    uVar3 = *(undefined8 *)(this->m_lookupSpec->minCoord).m_data;
    s.m_data[0] = (float)uVar3 * fVar22;
    s.m_data[1] = (float)((ulong)uVar3 >> 0x20) * fVar22;
    CVar26 = tcu::getCubeFaceCoords((Vec3 *)&s);
    pTVar2 = this->m_lookupSpec;
    s.m_data[2] = (pTVar2->minCoord).m_data[2] * fVar22;
    s.m_data[0] = (pTVar2->maxCoord).m_data[0] * fVar22;
    s.m_data[1] = (pTVar2->minCoord).m_data[1] * fVar22;
    CVar27 = tcu::getCubeFaceCoords((Vec3 *)&s);
    pTVar2 = this->m_lookupSpec;
    s.m_data[2] = fVar22 * (pTVar2->minCoord).m_data[2];
    s.m_data[0] = fVar22 * (pTVar2->minCoord).m_data[0];
    s.m_data[1] = fVar22 * (pTVar2->maxCoord).m_data[1];
    CVar28 = tcu::getCubeFaceCoords((Vec3 *)&s);
    lookupParams_1.lod =
         TextureTestUtil::computeLodFromDerivates
                   (LODMODE_EXACT,
                    ((float)this->m_textureSpec->width * (CVar27.s - CVar26.s)) /
                    (float)viewportSize.m_data[0],0.0,0.0,
                    ((float)this->m_textureSpec->height * (CVar28.t - CVar26.t)) /
                    (float)viewportSize.m_data[1]);
    pTVar10 = (TextureBinding *)operator_new(0x68);
    uVar3 = colorA_1.m_data._0_8_;
    colorA_1.m_data[0] = 0.0;
    colorA_1.m_data[1] = 0.0;
    TextureBinding::TextureBinding(pTVar10,(TextureCubeArray *)uVar3,&this->m_textureSpec->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)&s,pTVar10);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
    ::emplace_back<de::SharedPtr<vkt::sr::TextureBinding>>
              ((vector<de::SharedPtr<vkt::sr::TextureBinding>,std::allocator<de::SharedPtr<vkt::sr::TextureBinding>>>
                *)&(this->super_ShaderRenderCaseInstance).m_textures,
               (SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr((SharedPtr<vkt::sr::TextureBinding> *)&s);
    de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
    ~UniqueBase((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
                &colorA_1);
  }
  iVar6 = (this->m_lookupSpec->offset).m_data[2];
  uVar3 = *(undefined8 *)(this->m_lookupSpec->offset).m_data;
  lookupParams_1.offset.m_data[0] = (int)uVar3;
  lookupParams_1.offset.m_data[1] = (int)((ulong)uVar3 >> 0x20);
  pTVar4 = this->m_lookupParams;
  *(undefined8 *)(pTVar4->scale).m_data = lodCoordTrans._32_8_;
  *(undefined8 *)((pTVar4->scale).m_data + 2) = lodCoordTrans._40_8_;
  *(undefined8 *)(pTVar4->bias).m_data = lodCoordTrans._48_8_;
  *(undefined8 *)((pTVar4->bias).m_data + 2) = lodCoordTrans._56_8_;
  pTVar4->lod = lookupParams_1.lod;
  (pTVar4->offset).m_data[0] = lookupParams_1.offset.m_data[0];
  *(ulong *)((pTVar4->offset).m_data + 1) = CONCAT44(iVar6,lookupParams_1.offset.m_data[1]);
  return;
}

Assistant:

ShaderTextureFunctionInstance::ShaderTextureFunctionInstance (Context&						context,
															  const bool					isVertexCase,
															  const ShaderEvaluator&		evaluator,
															  const UniformSetup&			uniformSetup,
															  const TextureLookupSpec&		lookupSpec,
															  const TextureSpec&			textureSpec,
															  const TexLookupParams&		lookupParams,
															  const ImageBackingMode		imageBackingMode)
	: ShaderRenderCaseInstance	(context, isVertexCase, evaluator, uniformSetup, DE_NULL, imageBackingMode)
	, m_lookupSpec				(lookupSpec)
	, m_textureSpec				(textureSpec)
	, m_lookupParams			(lookupParams)
{
	checkDeviceFeatures(m_context, m_textureSpec.type);

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));

		useAttribute(4u, A_IN0);
	}

	bool hasLodBias	= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	bool isGrad		= functionHasGrad(m_lookupSpec.function);
	DE_ASSERT(!isGrad || !hasLodBias);

	if (hasLodBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));

		useAttribute(5u, A_IN1);
	}
	else if (isGrad)
	{
		Vec3 sx = m_lookupSpec.maxDX-m_lookupSpec.minDX;
		Vec3 sy = m_lookupSpec.maxDY-m_lookupSpec.minDY;
		float gradDxTrans[] =
		{
			sx.x()/2.0f,	sx.x()/2.0f,	0.f,	m_lookupSpec.minDX.x(),
			sx.y()/2.0f,	sx.y()/2.0f,	0.0f,	m_lookupSpec.minDX.y(),
			sx.z()/2.0f,	sx.z()/2.0f,	0.0f,	m_lookupSpec.minDX.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};
		float gradDyTrans[] =
		{
			-sy.x()/2.0f,	-sy.x()/2.0f,	0.f,	m_lookupSpec.maxDY.x(),
			-sy.y()/2.0f,	-sy.y()/2.0f,	0.0f,	m_lookupSpec.maxDY.y(),
			-sy.z()/2.0f,	-sy.z()/2.0f,	0.0f,	m_lookupSpec.maxDY.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(gradDxTrans));
		m_userAttribTransforms.push_back(tcu::Mat4(gradDyTrans));

		useAttribute(5u, A_IN1);
		useAttribute(6u, A_IN2);
	}

	initTexture();
}